

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# main.cpp
# Opt level: O0

void report_volume_text(pa_sink_info *i)

{
  uint32_t uVar1;
  ostream *poVar2;
  uint32_t volume;
  pa_sink_info *i_local;
  
  if (i->mute == 0) {
    uVar1 = get_max_volume(i);
    poVar2 = (ostream *)std::ostream::operator<<(&std::cout,((double)uVar1 * 100.0) / 65536.0);
    std::operator<<(poVar2,"%\n");
  }
  else {
    std::operator<<((ostream *)&std::cout,"muted\n");
  }
  return;
}

Assistant:

void report_volume_text(const pa_sink_info *i) {
    if (i->mute) {
        cout << "muted\n";
    } else {
        // Use volume of the channel with the greatest value
        uint32_t volume = get_max_volume(i);
        cout << 100. * float(volume) / PA_VOLUME_NORM << "%\n";
    }
}